

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.c
# Opt level: O0

void parse_pp_info(void)

{
  int iVar1;
  uint uVar2;
  char *pcVar3;
  ushort **ppuVar4;
  size_t sVar5;
  char newfile [1024];
  int newline;
  char *p2;
  char *p;
  undefined5 in_stack_fffffffffffffbe0;
  undefined1 in_stack_fffffffffffffbe5;
  undefined1 in_stack_fffffffffffffbe6;
  undefined1 in_stack_fffffffffffffbe7;
  char local_418 [176];
  char *local_10;
  
  pcVar3 = pp_get_token();
  uVar2 = line;
  local_10 = pcVar3;
  if (pcVar3 != (char *)0x0) {
    for (; *local_10 != '\0'; local_10 = local_10 + 1) {
      ppuVar4 = __ctype_b_loc();
      if (((*ppuVar4)[(int)*local_10] & 0x800) == 0) {
        while (l != 10 && l != -1) {
          readbyte();
        }
        err(E,"invalid line number \"%s\"",pcVar3);
        return;
      }
    }
    iVar1 = atoi(pcVar3);
    uVar2 = iVar1 - 1;
    pcVar3 = pp_get_token();
    local_10 = pcVar3;
    if (pcVar3 != (char *)0x0) {
      for (; *local_10 != '\0'; local_10 = local_10 + 1) {
      }
      if ((*pcVar3 == '\"') && (local_10[-1] == '\"')) {
        strcpy(local_418,pcVar3 + 1);
        sVar5 = strlen(pcVar3 + 1);
        local_418[sVar5 - 1] = '\0';
        pcVar3 = pp_get_token();
        if (pcVar3 == (char *)0x0) {
          esetfile((char *)CONCAT17(in_stack_fffffffffffffbe7,
                                    CONCAT16(in_stack_fffffffffffffbe6,
                                             CONCAT15(in_stack_fffffffffffffbe5,
                                                      in_stack_fffffffffffffbe0))));
        }
        else {
          err(E,"unexpected flag \"%s\" in line directive",pcVar3);
          while (l != 10 && l != -1) {
            readbyte();
          }
          line = uVar2;
          esetfile((char *)CONCAT17(in_stack_fffffffffffffbe7,
                                    CONCAT16(in_stack_fffffffffffffbe6,
                                             CONCAT15(l != 10 && l != -1,in_stack_fffffffffffffbe0))
                                   ));
          uVar2 = line;
        }
      }
      else {
        err(E,"\"%s\" is not a valid filename",pcVar3);
        while (l != 10 && l != -1) {
          readbyte();
        }
      }
    }
  }
  line = uVar2;
  return;
}

Assistant:

void parse_pp_info()
{
    char* p;
    char* p2;
    int newline;
    char newfile[1024];

    /* get line number token */
    if (!(p = pp_get_token()))
        return;

    /* verify format */
    p2 = p;
    while (*p2)
    {
        if (!isdigit(*p2))
        {
            while (l != '\n' && l != EOF)
                readbyte();
            err(E, "invalid line number \"%s\"", p);
            return;
        }
        ++p2;
    }

    newline = atoi(p) - 1;

    /* get file name token */
    if (!(p = pp_get_token()))
    {
        line = newline;
        return;
    }

    /* verify format */
    p2 = p;
    while (*p2)
        ++p2;
    --p2;
    if (*p != '"' || *p2 != '"')
    {
        err(E, "\"%s\" is not a valid filename", p);

        while (l != '\n' && l != EOF)
            readbyte();
        line = newline;
        return;
    }

    ++p;
    strcpy(newfile, p);
    newfile[strlen(p) - 1] = 0;

    /* check for unwanted tokens */
    if ((p = pp_get_token()))
    {
        err(E, "unexpected flag \"%s\" in line directive", p);

        while (l != '\n' && l != EOF)
            readbyte();


        line = newline;
        esetfile(newfile);
        return;
    }

    esetfile(newfile);
    line = newline;
}